

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  byte bVar2;
  int a_00;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  stbi_uc *psVar9;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  stbi__uint32 sVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  stbi_uc *psVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  byte *pbVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  byte *pbVar29;
  ulong uVar30;
  long lVar31;
  stbi_uc *psVar32;
  byte bVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  stbi_uc *psVar38;
  uint uVar39;
  ulong uVar40;
  long in_FS_OFFSET;
  bool bVar41;
  ulong local_60;
  ulong uVar10;
  
  bVar41 = depth == 0x10;
  a_00 = a->s->img_n;
  lVar25 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar41,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    pcVar11 = "outofmem";
  }
  else {
    iVar5 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar5 == 0) {
      pcVar11 = "too large";
    }
    else {
      iVar5 = a_00 * x;
      uVar6 = iVar5 * depth + 7U >> 3;
      uVar10 = (ulong)uVar6;
      if ((uVar6 + 1) * y <= raw_len) {
        uVar7 = x * out_n;
        uVar8 = uVar7 << bVar41;
        if (y != 0) {
          uVar24 = a_00 << bVar41;
          uVar6 = uVar7 - uVar6;
          if (7 < depth) {
            uVar6 = 0;
          }
          uVar30 = (ulong)uVar6;
          uVar37 = (ulong)uVar8;
          lVar27 = -uVar37;
          lVar22 = (long)(out_n << bVar41);
          iVar13 = x - 1;
          lVar28 = uVar30 - lVar22;
          lVar31 = uVar30 - uVar37;
          uVar17 = 0;
          uVar40 = 0;
          local_60 = (ulong)x;
          do {
            pbVar29 = raw + 1;
            bVar3 = *raw;
            uVar12 = (ulong)bVar3;
            if (uVar12 < 5) {
              if (depth < 8) {
                local_60 = uVar10;
                uVar24 = 1;
              }
              if (uVar40 == 0) {
                uVar12 = (ulong)""[uVar12];
              }
              psVar9 = a->out;
              if (0 < (int)uVar24) {
                lVar18 = lVar27 + uVar17 + uVar30;
                uVar34 = 0;
                do {
                  switch(uVar12) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar4 = pbVar29[uVar34];
                    goto LAB_001a93c0;
                  case 2:
                  case 4:
                    bVar4 = psVar9[uVar34 + lVar18];
                    break;
                  case 3:
                    bVar4 = psVar9[uVar34 + lVar18] >> 1;
                    break;
                  default:
                    goto switchD_001a93a6_default;
                  }
                  bVar4 = bVar4 + pbVar29[uVar34];
LAB_001a93c0:
                  psVar9[uVar34 + uVar17 + uVar30] = bVar4;
switchD_001a93a6_default:
                  uVar34 = uVar34 + 1;
                } while (uVar24 != uVar34);
              }
              lVar18 = uVar8 * (int)uVar40 + uVar30;
              if (depth == 8) {
                lVar16 = (long)out_n;
                lVar15 = lVar25;
                if (a_00 != out_n) {
                  psVar9[lVar25 + lVar18] = 0xff;
                }
LAB_001a943e:
                pbVar29 = pbVar29 + lVar15;
              }
              else {
                if (depth == 0x10) {
                  lVar15 = (long)(int)uVar24;
                  lVar16 = lVar22;
                  if (a_00 != out_n) {
                    (psVar9 + lVar15 + lVar18)[0] = 0xff;
                    (psVar9 + lVar15 + lVar18)[1] = 0xff;
                  }
                  goto LAB_001a943e;
                }
                pbVar29 = raw + 2;
                lVar16 = 1;
              }
              psVar38 = psVar9 + lVar16 + lVar18;
              if (a_00 == out_n || depth < 8) {
                uVar6 = ((int)local_60 + -1) * uVar24;
                switch(uVar12) {
                case 0:
                  memcpy(psVar38,pbVar29,(long)(int)uVar6);
                  break;
                case 1:
                  if (0 < (int)uVar6) {
                    uVar12 = 0;
                    do {
                      psVar9[uVar12 + lVar16 + uVar17 + uVar30] =
                           psVar9[uVar12 + ((lVar16 + uVar17) - (long)(int)uVar24) + uVar30] +
                           pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar6) {
                    lVar18 = lVar16 + uVar17 + uVar30;
                    uVar12 = 0;
                    do {
                      psVar9[uVar12 + lVar18] = psVar9[uVar12 + lVar27 + lVar18] + pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar6) {
                    lVar16 = lVar16 + uVar17;
                    uVar12 = 0;
                    do {
                      psVar9[uVar12 + lVar16 + uVar30] =
                           (char)((uint)psVar9[uVar12 + (lVar16 - (int)uVar24) + uVar30] +
                                  (uint)psVar9[uVar12 + lVar16 + lVar31] >> 1) + pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar6) {
                    lVar16 = lVar16 + uVar17;
                    uVar12 = 0;
                    do {
                      bVar4 = psVar9[uVar12 + (lVar16 - (int)uVar24) + uVar30];
                      bVar2 = psVar9[uVar12 + lVar16 + lVar31];
                      bVar33 = psVar9[uVar12 + (lVar16 - (int)uVar24) + lVar31];
                      iVar35 = ((uint)bVar2 + (uint)bVar4) - (uint)bVar33;
                      uVar20 = iVar35 - (uint)bVar4;
                      uVar21 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar21 = uVar20;
                      }
                      uVar39 = iVar35 - (uint)bVar2;
                      uVar20 = -uVar39;
                      if (0 < (int)uVar39) {
                        uVar20 = uVar39;
                      }
                      uVar36 = iVar35 - (uint)bVar33;
                      uVar39 = -uVar36;
                      if (0 < (int)uVar36) {
                        uVar39 = uVar36;
                      }
                      if (uVar20 <= uVar39) {
                        bVar33 = bVar2;
                      }
                      if (uVar39 < uVar21) {
                        bVar4 = bVar33;
                      }
                      if (uVar20 < uVar21) {
                        bVar4 = bVar33;
                      }
                      psVar9[uVar12 + lVar16 + uVar30] = bVar4 + pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar6) {
                    uVar12 = 0;
                    do {
                      psVar9[uVar12 + lVar16 + uVar17 + uVar30] =
                           (psVar9[uVar12 + ((lVar16 + uVar17) - (long)(int)uVar24) + uVar30] >> 1)
                           + pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar6) {
                    uVar12 = 0;
                    do {
                      psVar9[uVar12 + lVar16 + uVar17 + uVar30] =
                           psVar9[uVar12 + ((lVar16 + uVar17) - (long)(int)uVar24) + uVar30] +
                           pbVar29[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar6 != uVar12);
                  }
                }
                pbVar29 = pbVar29 + (int)uVar6;
              }
              else {
                if ((byte)uVar12 < 7) {
                  psVar19 = psVar9 + lVar16 + lVar27 + lVar18;
                  switch(uVar12) {
                  case 0:
                    if (iVar13 != 0) {
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] = pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 1:
                    if (iVar13 != 0) {
                      psVar9 = psVar9 + lVar16 + uVar17 + lVar28;
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] = psVar9[uVar12] + pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        psVar9 = psVar9 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 2:
                    if (iVar13 != 0) {
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] = psVar38[uVar12 + lVar27] + pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 3:
                    if (iVar13 != 0) {
                      psVar9 = psVar9 + lVar16 + uVar17 + lVar28;
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] =
                                 (char)((uint)psVar9[uVar12] + (uint)psVar19[uVar12] >> 1) +
                                 pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        psVar19 = psVar19 + lVar22;
                        psVar9 = psVar9 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 4:
                    if (iVar13 != 0) {
                      psVar32 = psVar9 + lVar16 + uVar17 + lVar28;
                      psVar9 = psVar9 + lVar16 + uVar17 + (lVar28 - uVar37);
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            bVar4 = psVar32[uVar12];
                            bVar2 = psVar19[uVar12];
                            bVar33 = psVar9[uVar12];
                            iVar26 = ((uint)bVar2 + (uint)bVar4) - (uint)bVar33;
                            uVar21 = iVar26 - (uint)bVar4;
                            uVar6 = -uVar21;
                            if (0 < (int)uVar21) {
                              uVar6 = uVar21;
                            }
                            uVar20 = iVar26 - (uint)bVar2;
                            uVar21 = -uVar20;
                            if (0 < (int)uVar20) {
                              uVar21 = uVar20;
                            }
                            uVar39 = iVar26 - (uint)bVar33;
                            uVar20 = -uVar39;
                            if (0 < (int)uVar39) {
                              uVar20 = uVar39;
                            }
                            if (uVar21 <= uVar20) {
                              bVar33 = bVar2;
                            }
                            if (uVar20 < uVar6) {
                              bVar4 = bVar33;
                            }
                            if (uVar21 < uVar6) {
                              bVar4 = bVar33;
                            }
                            psVar38[uVar12] = bVar4 + pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        psVar19 = psVar19 + lVar22;
                        psVar32 = psVar32 + lVar22;
                        psVar9 = psVar9 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 5:
                    if (iVar13 != 0) {
                      psVar9 = psVar9 + lVar16 + uVar17 + lVar28;
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] = (psVar9[uVar12] >> 1) + pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        psVar9 = psVar9 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                    break;
                  case 6:
                    if (iVar13 != 0) {
                      psVar9 = psVar9 + lVar16 + uVar17 + lVar28;
                      iVar35 = iVar13;
                      do {
                        if (0 < (int)uVar24) {
                          uVar12 = 0;
                          do {
                            psVar38[uVar12] = psVar9[uVar12] + pbVar29[uVar12];
                            uVar12 = uVar12 + 1;
                          } while (uVar24 != uVar12);
                        }
                        psVar38[(int)uVar24] = 0xff;
                        pbVar29 = pbVar29 + (int)uVar24;
                        psVar38 = psVar38 + lVar22;
                        psVar9 = psVar9 + lVar22;
                        iVar35 = iVar35 + -1;
                      } while (iVar35 != 0);
                    }
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar9 = a->out + (long)(int)uVar24 + uVar17 + 1;
                  sVar14 = x;
                  do {
                    *psVar9 = 0xff;
                    psVar9 = psVar9 + lVar22;
                    sVar14 = sVar14 - 1;
                  } while (sVar14 != 0);
                }
              }
            }
            else {
              *(char **)(in_FS_OFFSET + -0x10) = "invalid filter";
            }
            if (4 < bVar3) {
              return 0;
            }
            uVar40 = uVar40 + 1;
            uVar17 = (ulong)((int)uVar17 + uVar8);
            raw = pbVar29;
          } while (uVar40 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar7 * y != 0) {
            psVar9 = a->out;
            lVar25 = 0;
            do {
              uVar1 = swap_bytes(*(undefined2 *)(psVar9 + lVar25 * 2));
              *(undefined2 *)(psVar9 + lVar25 * 2) = uVar1;
              lVar25 = lVar25 + 1;
            } while (uVar7 * y != (int)lVar25);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar6 = x - 1;
        lVar25 = uVar7 - uVar10;
        lVar22 = (ulong)uVar6 + 1;
        uVar24 = 0;
        uVar37 = 0;
        do {
          bVar3 = 1;
          if (color == 0) {
            bVar3 = ""[depth];
          }
          psVar9 = a->out;
          pbVar23 = psVar9 + uVar8 * (int)uVar37;
          pbVar29 = pbVar23 + (uVar7 - uVar10);
          uVar17 = (ulong)uVar24;
          if (depth == 4) {
            iVar13 = iVar5;
            if (1 < iVar5) {
              psVar38 = psVar9 + lVar25;
              iVar35 = iVar5;
              do {
                psVar9[uVar17] = (psVar38[uVar17] >> 4) * bVar3;
                psVar9[uVar17 + 1] = (psVar38[uVar17] & 0xf) * bVar3;
                iVar13 = iVar35 + -2;
                psVar38 = psVar38 + 1;
                psVar9 = psVar9 + 2;
                bVar41 = 3 < iVar35;
                iVar35 = iVar13;
              } while (bVar41);
              pbVar29 = psVar38 + uVar17;
              pbVar23 = psVar9 + uVar17;
            }
            if (iVar13 == 1) {
              bVar4 = *pbVar29 >> 4;
LAB_001a9d5f:
              bVar3 = bVar4 * bVar3;
LAB_001a9d62:
              *pbVar23 = bVar3;
            }
          }
          else if (depth == 2) {
            iVar13 = iVar5;
            if (3 < iVar5) {
              psVar38 = psVar9 + lVar25;
              iVar35 = iVar5;
              do {
                psVar9[uVar17] = (psVar38[uVar17] >> 6) * bVar3;
                psVar9[uVar17 + 1] = (psVar38[uVar17] >> 4 & 3) * bVar3;
                psVar9[uVar17 + 2] = (psVar38[uVar17] >> 2 & 3) * bVar3;
                psVar9[uVar17 + 3] = (psVar38[uVar17] & 3) * bVar3;
                iVar13 = iVar35 + -4;
                psVar38 = psVar38 + 1;
                psVar9 = psVar9 + 4;
                bVar41 = 7 < iVar35;
                iVar35 = iVar13;
              } while (bVar41);
              pbVar29 = psVar38 + uVar17;
              pbVar23 = psVar9 + uVar17;
            }
            if (0 < iVar13) {
              *pbVar23 = (*pbVar29 >> 6) * bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (1 < iVar13) {
              *pbVar23 = (*pbVar29 >> 4 & 3) * bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (iVar13 == 3) {
              bVar4 = *pbVar29 >> 2 & 3;
              goto LAB_001a9d5f;
            }
          }
          else if (depth == 1) {
            iVar13 = iVar5;
            if (7 < iVar5) {
              psVar38 = psVar9 + lVar25;
              iVar35 = iVar5;
              do {
                psVar9[uVar17] = (char)psVar38[uVar17] >> 7 & bVar3;
                psVar9[uVar17 + 1] = (char)(psVar38[uVar17] * '\x02') >> 7 & bVar3;
                psVar9[uVar17 + 2] = (char)(psVar38[uVar17] << 2) >> 7 & bVar3;
                psVar9[uVar17 + 3] = (char)(psVar38[uVar17] << 3) >> 7 & bVar3;
                psVar9[uVar17 + 4] = (char)(psVar38[uVar17] << 4) >> 7 & bVar3;
                psVar9[uVar17 + 5] = (char)(psVar38[uVar17] << 5) >> 7 & bVar3;
                psVar9[uVar17 + 6] = (char)(psVar38[uVar17] << 6) >> 7 & bVar3;
                bVar4 = bVar3;
                if ((psVar38[uVar17] & 1) == 0) {
                  bVar4 = 0;
                }
                psVar9[uVar17 + 7] = bVar4;
                iVar13 = iVar35 + -8;
                psVar38 = psVar38 + 1;
                psVar9 = psVar9 + 8;
                bVar41 = 0xf < iVar35;
                iVar35 = iVar13;
              } while (bVar41);
              pbVar29 = psVar38 + uVar17;
              pbVar23 = psVar9 + uVar17;
            }
            if (0 < iVar13) {
              *pbVar23 = (char)*pbVar29 >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (1 < iVar13) {
              *pbVar23 = (char)(*pbVar29 * '\x02') >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (2 < iVar13) {
              *pbVar23 = (char)(*pbVar29 << 2) >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (3 < iVar13) {
              *pbVar23 = (char)(*pbVar29 << 3) >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (4 < iVar13) {
              *pbVar23 = (char)(*pbVar29 << 4) >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (5 < iVar13) {
              *pbVar23 = (char)(*pbVar29 << 5) >> 7 & bVar3;
              pbVar23 = pbVar23 + 1;
            }
            if (iVar13 == 7) {
              bVar3 = (char)(*pbVar29 << 6) >> 7 & bVar3;
              goto LAB_001a9d62;
            }
          }
          if (a_00 != out_n) {
            psVar9 = a->out;
            if (a_00 == 1) {
              lVar27 = lVar22;
              if (-1 < (int)uVar6) {
                do {
                  psVar9[lVar27 * 2 + (uVar17 - 1)] = 0xff;
                  psVar9[lVar27 * 2 + (uVar17 - 2)] = psVar9[lVar27 + (uVar17 - 1)];
                  lVar28 = lVar27 + -1;
                  bVar41 = 0 < lVar27;
                  lVar27 = lVar28;
                } while (lVar28 != 0 && bVar41);
              }
            }
            else if (-1 < (int)uVar6) {
              psVar38 = psVar9 + (ulong)uVar6 * 3 + 2 + uVar17;
              lVar27 = lVar22;
              do {
                psVar9[lVar27 * 4 + (uVar17 - 1)] = 0xff;
                psVar9[lVar27 * 4 + (uVar17 - 2)] = *psVar38;
                psVar9[lVar27 * 4 + (uVar17 - 3)] = psVar38[-1];
                psVar9[lVar27 * 4 + (uVar17 - 4)] = psVar38[-2];
                psVar38 = psVar38 + -3;
                lVar28 = lVar27 + -1;
                bVar41 = 0 < lVar27;
                lVar27 = lVar28;
              } while (lVar28 != 0 && bVar41);
            }
          }
          uVar37 = uVar37 + 1;
          uVar24 = uVar24 + uVar8;
          if (uVar37 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar11 = "not enough pixels";
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar11;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }